

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void cimg_library::CImg<unsigned_char>::_load_inr_header(FILE *file,int *out,float *voxel_size)

{
  int iVar1;
  CImgIOException *this;
  CImg<char> item;
  char tmp2 [64];
  char tmp1 [64];
  
  CImg<char>::CImg(&item,0x400,1,1,1);
  *item._data = '\0';
  tmp1[0x30] = '\0';
  tmp1[0x31] = '\0';
  tmp1[0x32] = '\0';
  tmp1[0x33] = '\0';
  tmp1[0x34] = '\0';
  tmp1[0x35] = '\0';
  tmp1[0x36] = '\0';
  tmp1[0x37] = '\0';
  tmp1[0x38] = '\0';
  tmp1[0x39] = '\0';
  tmp1[0x3a] = '\0';
  tmp1[0x3b] = '\0';
  tmp1[0x3c] = '\0';
  tmp1[0x3d] = '\0';
  tmp1[0x3e] = '\0';
  tmp1[0x3f] = '\0';
  tmp1[0x20] = '\0';
  tmp1[0x21] = '\0';
  tmp1[0x22] = '\0';
  tmp1[0x23] = '\0';
  tmp1[0x24] = '\0';
  tmp1[0x25] = '\0';
  tmp1[0x26] = '\0';
  tmp1[0x27] = '\0';
  tmp1[0x28] = '\0';
  tmp1[0x29] = '\0';
  tmp1[0x2a] = '\0';
  tmp1[0x2b] = '\0';
  tmp1[0x2c] = '\0';
  tmp1[0x2d] = '\0';
  tmp1[0x2e] = '\0';
  tmp1[0x2f] = '\0';
  tmp1[0x10] = '\0';
  tmp1[0x11] = '\0';
  tmp1[0x12] = '\0';
  tmp1[0x13] = '\0';
  tmp1[0x14] = '\0';
  tmp1[0x15] = '\0';
  tmp1[0x16] = '\0';
  tmp1[0x17] = '\0';
  tmp1[0x18] = '\0';
  tmp1[0x19] = '\0';
  tmp1[0x1a] = '\0';
  tmp1[0x1b] = '\0';
  tmp1[0x1c] = '\0';
  tmp1[0x1d] = '\0';
  tmp1[0x1e] = '\0';
  tmp1[0x1f] = '\0';
  tmp1[0] = '\0';
  tmp1[1] = '\0';
  tmp1[2] = '\0';
  tmp1[3] = '\0';
  tmp1[4] = '\0';
  tmp1[5] = '\0';
  tmp1[6] = '\0';
  tmp1[7] = '\0';
  tmp1[8] = '\0';
  tmp1[9] = '\0';
  tmp1[10] = '\0';
  tmp1[0xb] = '\0';
  tmp1[0xc] = '\0';
  tmp1[0xd] = '\0';
  tmp1[0xe] = '\0';
  tmp1[0xf] = '\0';
  tmp2[0x30] = '\0';
  tmp2[0x31] = '\0';
  tmp2[0x32] = '\0';
  tmp2[0x33] = '\0';
  tmp2[0x34] = '\0';
  tmp2[0x35] = '\0';
  tmp2[0x36] = '\0';
  tmp2[0x37] = '\0';
  tmp2[0x38] = '\0';
  tmp2[0x39] = '\0';
  tmp2[0x3a] = '\0';
  tmp2[0x3b] = '\0';
  tmp2[0x3c] = '\0';
  tmp2[0x3d] = '\0';
  tmp2[0x3e] = '\0';
  tmp2[0x3f] = '\0';
  tmp2[0x20] = '\0';
  tmp2[0x21] = '\0';
  tmp2[0x22] = '\0';
  tmp2[0x23] = '\0';
  tmp2[0x24] = '\0';
  tmp2[0x25] = '\0';
  tmp2[0x26] = '\0';
  tmp2[0x27] = '\0';
  tmp2[0x28] = '\0';
  tmp2[0x29] = '\0';
  tmp2[0x2a] = '\0';
  tmp2[0x2b] = '\0';
  tmp2[0x2c] = '\0';
  tmp2[0x2d] = '\0';
  tmp2[0x2e] = '\0';
  tmp2[0x2f] = '\0';
  tmp2[0x10] = '\0';
  tmp2[0x11] = '\0';
  tmp2[0x12] = '\0';
  tmp2[0x13] = '\0';
  tmp2[0x14] = '\0';
  tmp2[0x15] = '\0';
  tmp2[0x16] = '\0';
  tmp2[0x17] = '\0';
  tmp2[0x18] = '\0';
  tmp2[0x19] = '\0';
  tmp2[0x1a] = '\0';
  tmp2[0x1b] = '\0';
  tmp2[0x1c] = '\0';
  tmp2[0x1d] = '\0';
  tmp2[0x1e] = '\0';
  tmp2[0x1f] = '\0';
  tmp2[0] = '\0';
  tmp2[1] = '\0';
  tmp2[2] = '\0';
  tmp2[3] = '\0';
  tmp2[4] = '\0';
  tmp2[5] = '\0';
  tmp2[6] = '\0';
  tmp2[7] = '\0';
  tmp2[8] = '\0';
  tmp2[9] = '\0';
  tmp2[10] = '\0';
  tmp2[0xb] = '\0';
  tmp2[0xc] = '\0';
  tmp2[0xd] = '\0';
  tmp2[0xe] = '\0';
  tmp2[0xf] = '\0';
  __isoc99_fscanf(file,"%63s",item._data);
  out[0] = 1;
  out[1] = 1;
  out[2] = 1;
  out[3] = 1;
  out[4] = -1;
  out[5] = 1;
  out[6] = -1;
  out[7] = -1;
  iVar1 = cimg::strncasecmp(item._data,"#INRIMAGE-4#{",0xd);
  if (iVar1 == 0) {
    do {
      while( true ) {
        do {
          iVar1 = __isoc99_fscanf(file," %63[^\n]%*c",item._data);
          if ((iVar1 == -1) ||
             (((*item._data == '#' && (item._data[1] == '#')) && (item._data[2] == '}')))) {
            if ((((*out < 0) || (out[1] < 0)) || (out[2] < 0)) || (out[3] < 0)) {
              this = (CImgIOException *)__cxa_allocate_exception(0x10);
              CImgIOException::CImgIOException
                        (this,
                         "CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header."
                         ,"unsigned char",(ulong)(uint)*out,(ulong)(uint)out[1],(ulong)(uint)out[2],
                         out[3]);
            }
            else if ((out[4] < 0) || (out[5] < 0)) {
              this = (CImgIOException *)__cxa_allocate_exception(0x10);
              CImgIOException::CImgIOException
                        (this,"CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                         "unsigned char");
            }
            else if (out[6] < 0) {
              this = (CImgIOException *)__cxa_allocate_exception(0x10);
              CImgIOException::CImgIOException
                        (this,"CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                         "unsigned char");
            }
            else {
              if (-1 < out[7]) {
                CImg<char>::~CImg(&item);
                return;
              }
              this = (CImgIOException *)__cxa_allocate_exception(0x10);
              CImgIOException::CImgIOException
                        (this,
                         "CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                         "unsigned char");
            }
            goto LAB_00130068;
          }
          __isoc99_sscanf(item._data," XDIM%*[^0-9]%d",out);
          __isoc99_sscanf(item._data," YDIM%*[^0-9]%d",out + 1);
          __isoc99_sscanf(item._data," ZDIM%*[^0-9]%d",out + 2);
          __isoc99_sscanf(item._data," VDIM%*[^0-9]%d",out + 3);
          __isoc99_sscanf(item._data," PIXSIZE%*[^0-9]%d",out + 6);
          if (voxel_size != (float *)0x0) {
            __isoc99_sscanf(item._data," VX%*[^0-9.+-]%f",voxel_size);
            __isoc99_sscanf(item._data," VY%*[^0-9.+-]%f",voxel_size + 1);
            __isoc99_sscanf(item._data," VZ%*[^0-9.+-]%f",voxel_size + 2);
          }
          iVar1 = __isoc99_sscanf(item._data," CPU%*[ =]%s",tmp1);
          if (iVar1 != 0) {
            iVar1 = cimg::strncasecmp(tmp1,"sun",3);
            out[7] = (uint)(iVar1 == 0);
          }
          iVar1 = __isoc99_sscanf(item._data," TYPE%*[ =]%s %s",tmp1,tmp2);
        } while (iVar1 == 0);
        if (iVar1 != 1) {
          if (iVar1 != 2) goto LAB_00130040;
          iVar1 = cimg::strncasecmp(tmp1,"unsigned",8);
          out[5] = (uint)(iVar1 != 0);
          strncpy(tmp1,tmp2,0x3f);
        }
        iVar1 = cimg::strncasecmp(tmp1,"int",3);
        if ((iVar1 == 0) || (iVar1 = cimg::strncasecmp(tmp1,"fixed",5), iVar1 == 0)) {
          out[4] = 0;
        }
        iVar1 = cimg::strncasecmp(tmp1,"float",5);
        if ((iVar1 == 0) || (iVar1 = cimg::strncasecmp(tmp1,"double",6), iVar1 == 0)) {
          out[4] = 1;
        }
        iVar1 = cimg::strncasecmp(tmp1,"packed",6);
        if (iVar1 != 0) break;
        out[4] = 2;
      }
    } while (-1 < out[4]);
LAB_00130040:
    this = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (this,"CImg<%s>::load_inr(): Invalid pixel type \'%s\' defined in header.",
               "unsigned char",tmp2);
  }
  else {
    this = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (this,"CImg<%s>::load_inr(): INRIMAGE-4 header not found.","unsigned char");
  }
LAB_00130068:
  __cxa_throw(this,&CImgIOException::typeinfo,CImgException::~CImgException);
}

Assistant:

static void _load_inr_header(std::FILE *file, int out[8], float *const voxel_size) {
      CImg<charT> item(1024); *item = 0;
      char tmp1[64] = { 0 }, tmp2[64] = { 0 };
      out[0] = std::fscanf(file,"%63s",item._data);
      out[0] = out[1] = out[2] = out[3] = out[5] = 1; out[4] = out[6] = out[7] = -1;
      if(cimg::strncasecmp(item,"#INRIMAGE-4#{",13)!=0)
        throw CImgIOException("CImg<%s>::load_inr(): INRIMAGE-4 header not found.",
                              pixel_type());

      while (std::fscanf(file," %63[^\n]%*c",item._data)!=EOF && std::strncmp(item,"##}",3)) {
        cimg_sscanf(item," XDIM%*[^0-9]%d",out);
        cimg_sscanf(item," YDIM%*[^0-9]%d",out + 1);
        cimg_sscanf(item," ZDIM%*[^0-9]%d",out + 2);
        cimg_sscanf(item," VDIM%*[^0-9]%d",out + 3);
        cimg_sscanf(item," PIXSIZE%*[^0-9]%d",out + 6);
        if (voxel_size) {
          cimg_sscanf(item," VX%*[^0-9.+-]%f",voxel_size);
          cimg_sscanf(item," VY%*[^0-9.+-]%f",voxel_size + 1);
          cimg_sscanf(item," VZ%*[^0-9.+-]%f",voxel_size + 2);
        }
        if (cimg_sscanf(item," CPU%*[ =]%s",tmp1)) out[7]=cimg::strncasecmp(tmp1,"sun",3)?0:1;
        switch (cimg_sscanf(item," TYPE%*[ =]%s %s",tmp1,tmp2)) {
        case 0 : break;
        case 2 : out[5] = cimg::strncasecmp(tmp1,"unsigned",8)?1:0; std::strncpy(tmp1,tmp2,sizeof(tmp1) - 1);
        case 1 :
          if (!cimg::strncasecmp(tmp1,"int",3)   || !cimg::strncasecmp(tmp1,"fixed",5))  out[4] = 0;
          if (!cimg::strncasecmp(tmp1,"float",5) || !cimg::strncasecmp(tmp1,"double",6)) out[4] = 1;
          if (!cimg::strncasecmp(tmp1,"packed",6))                                       out[4] = 2;
          if (out[4]>=0) break;
        default :
          throw CImgIOException("CImg<%s>::load_inr(): Invalid pixel type '%s' defined in header.",
                                pixel_type(),
                                tmp2);
        }
      }
      if(out[0]<0 || out[1]<0 || out[2]<0 || out[3]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                              pixel_type(),
                              out[0],out[1],out[2],out[3]);
      if(out[4]<0 || out[5]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                              pixel_type());
      if(out[6]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                              pixel_type());
      if(out[7]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                              pixel_type());
    }